

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitorTests.cpp
# Opt level: O0

void __thiscall
PrintVisitorTest_BinaryOperation_Test::TestBody(PrintVisitorTest_BinaryOperation_Test *this)

{
  bool bVar1;
  pointer pBVar2;
  AssertionResult gtest_ar;
  string expected;
  __single_object node;
  PrintVisitor visitor;
  stringstream result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  PrintVisitor *in_stack_fffffffffffffdb0;
  char *rhs_expression;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  char *in_stack_fffffffffffffdc0;
  string local_238 [4];
  Type in_stack_fffffffffffffdcc;
  allocator<char> *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
  *in_stack_fffffffffffffde8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffdf0;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
  *in_stack_fffffffffffffdf8;
  string local_200 [24];
  Message *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 uVar3;
  undefined1 local_1a8 [24];
  stringstream local_190 [400];
  
  std::__cxx11::stringstream::stringstream(local_190);
  PrintVisitor::PrintVisitor
            (in_stack_fffffffffffffdb0,
             (ostream *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
             (uint)((ulong)in_stack_fffffffffffffda0 >> 0x20));
  std::make_unique<NumericLiteralNode,int>
            ((int *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  uVar3 = 2;
  std::make_unique<NumericLiteralNode,int>
            ((int *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            (in_stack_fffffffffffffdf8,(BinaryOperator *)in_stack_fffffffffffffdf0._M_head_impl,
             in_stack_fffffffffffffde8);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffda0);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffda0);
  pBVar2 = std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::operator->
                     ((unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)0x1c78c2);
  (*(pBVar2->super_ExpressionNode).super_Node._vptr_Node[2])(pBVar2,local_1a8);
  rhs_expression = &stack0xfffffffffffffdff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdff);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),rhs_expression,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),in_stack_fffffffffffffda0
            );
  std::__cxx11::string::~string(local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffde8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
    in_stack_fffffffffffffda0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1c7a8f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
               in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,rhs_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar3,in_stack_fffffffffffffe20),in_stack_fffffffffffffe18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffda0);
    testing::Message::~Message((Message *)0x1c7add);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c7b29);
  std::__cxx11::string::~string(local_200);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            ((unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)
             in_stack_fffffffffffffda0);
  PrintVisitor::~PrintVisitor((PrintVisitor *)0x1c7b4d);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

TEST(PrintVisitorTest, BinaryOperation)
{
  std::stringstream result;
  PrintVisitor visitor{result};
  auto node = std::make_unique<BinaryOpNode>(std::make_unique<NumericLiteralNode>(1), BinaryOperator::Addition, std::make_unique<NumericLiteralNode>(2));
  node->accept(visitor);

  std::string expected{"BinaryOpNode:\n NumericLiteral: 1\nAddition\n NumericLiteral: 2\n"};
  EXPECT_EQ(result.str(), expected);
}